

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iptables.c
# Opt level: O0

int match_chain(ip_chain_t *ipc,packet_t *pkt)

{
  list_head *plVar1;
  int iVar2;
  list_head *__mptr_1;
  list_head *__mptr;
  ip_rule_t *ipr;
  int target;
  packet_t *pkt_local;
  ip_chain_t *ipc_local;
  
  plVar1 = (ipc->rules).next;
  while( true ) {
    __mptr = plVar1 + -5;
    if (plVar1 == &ipc->rules) {
      return ipc->policy;
    }
    iVar2 = match_rule((ip_rule_t *)__mptr,pkt);
    if (iVar2 == 3) {
      return ipc->policy;
    }
    if (iVar2 == 0) {
      return 0;
    }
    if (iVar2 == 1) break;
    if (iVar2 == 2) {
      return 2;
    }
    plVar1 = plVar1->next;
  }
  return 1;
}

Assistant:

int match_chain(ip_chain_t *ipc, packet_t *pkt)
{
	int target = TARGET_NONE;
	ip_rule_t *ipr = NULL;

	list_for_each_entry(ipr, &ipc->rules, list) {
		target = match_rule(ipr, pkt);

		if (target == TARGET_RETURN) {
			return ipc->policy;
		}

		if (target == TARGET_DROP ||
			target == TARGET_ACCEPT ||
			target == TARGET_QUEUE) {
			return target;
		}
	}

	return ipc->policy;
}